

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O1

void __thiscall
QGraphicsLinearLayout::removeItem(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLinearLayoutPrivate *this_00;
  long lVar1;
  uint uVar2;
  long lVar3;
  QGridLayoutItem *gridItem;
  
  this_00 = (QGraphicsLinearLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  lVar1 = *(long *)&(this_00->engine).field_0x10;
  uVar2 = 0xffffffff;
  if (lVar1 != 0) {
    lVar3 = 0;
    do {
      if (*(QGraphicsLayoutItem **)
           (*(long *)(*(long *)&(this_00->engine).field_0x8 + lVar3 * 8) + 0x28) == item) {
        uVar2 = (uint)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  if ((int)uVar2 < 0) {
    gridItem = (QGridLayoutItem *)0x0;
  }
  else {
    gridItem = *(QGridLayoutItem **)(*(long *)&(this_00->engine).field_0x8 + (ulong)uVar2 * 8);
  }
  if (gridItem == (QGridLayoutItem *)0x0) {
    return;
  }
  QGraphicsLayoutItem::setParentLayoutItem(item,(QGraphicsLayoutItem *)0x0);
  QGraphicsLinearLayoutPrivate::removeGridItem(this_00,gridItem);
  (**(code **)(*(long *)gridItem + 8))(gridItem);
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
  return;
}

Assistant:

void QGraphicsLinearLayout::removeItem(QGraphicsLayoutItem *item)
{
    Q_D(QGraphicsLinearLayout);
    if (QGraphicsGridLayoutEngineItem *gridItem = d->engine.findLayoutItem(item)) {
        item->setParentLayoutItem(nullptr);
        d->removeGridItem(gridItem);
        delete gridItem;
        invalidate();
    }
}